

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

int __thiscall miniros::ServiceManager::shutdown(ServiceManager *this,int __fd,int __how)

{
  int iVar1;
  ServiceManager *pSVar2;
  string *psVar3;
  allocator<char> local_51;
  list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
  local_service_clients;
  
  std::recursive_mutex::lock(&this->shutting_down_mutex_);
  if (this->shutting_down_ == false) {
    this->shutting_down_ = true;
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (shutdown::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_service_clients,"miniros.service_manager",&local_51);
      console::initializeLogLocation(&shutdown::loc,(string *)&local_service_clients,Debug);
      std::__cxx11::string::~string((string *)&local_service_clients);
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel(&shutdown::loc,Debug);
      console::checkLogLocationEnabled(&shutdown::loc);
    }
    if (shutdown::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,shutdown::loc.logger_,shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                     ,0x5c,"void miniros::ServiceManager::shutdown()",
                     "ServiceManager::shutdown(): unregistering our advertised services");
    }
    std::mutex::lock(&this->service_publications_mutex_);
    pSVar2 = this;
    while (pSVar2 = (ServiceManager *)
                    (pSVar2->service_publications_).
                    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next, pSVar2 != this) {
      unregisterService(this,(string *)
                             ((pSVar2->service_publications_).
                              super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                              ._M_impl._M_node._M_size + 0x10));
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (shutdown()::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_service_clients,"miniros.service_manager",&local_51);
        console::initializeLogLocation(&shutdown()::loc,(string *)&local_service_clients,Debug);
        std::__cxx11::string::~string((string *)&local_service_clients);
      }
      if (shutdown()::loc.level_ != Debug) {
        console::setLogLocationLevel(&shutdown()::loc,Debug);
        console::checkLogLocationEnabled(&shutdown()::loc);
      }
      if (shutdown()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,shutdown()::loc.logger_,shutdown()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,99,"void miniros::ServiceManager::shutdown()","shutting down service %s",
                       *(undefined8 *)
                        ((pSVar2->service_publications_).
                         super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                         ._M_impl._M_node._M_size + 0x10));
      }
      ServicePublication::drop
                ((ServicePublication *)
                 (pSVar2->service_publications_).
                 super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                 ._M_impl._M_node._M_size);
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ::clear(&this->service_publications_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_publications_mutex_);
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node._M_size = 0;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_service_clients;
    local_service_clients.
    super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_service_clients;
    std::mutex::lock(&this->service_server_links_mutex_);
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::swap(&local_service_clients,&this->service_server_links_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->service_server_links_mutex_);
    psVar3 = (string *)&local_service_clients;
    while (psVar3 = (string *)(psVar3->_M_dataplus)._M_p, psVar3 != (string *)&local_service_clients
          ) {
      Connection::drop(*(Connection **)((psVar3->field_2)._M_allocated_capacity + 0x18),Destructing)
      ;
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::clear((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
             *)&local_service_clients.
                super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
           );
    std::__cxx11::
    _List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::_M_clear(&local_service_clients.
                super__List_base<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
              );
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->shutting_down_mutex_);
  return iVar1;
}

Assistant:

void ServiceManager::shutdown()
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return;
  }

  shutting_down_ = true;

  MINIROS_DEBUG("ServiceManager::shutdown(): unregistering our advertised services");
  {
    std::scoped_lock<std::mutex> ss_lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      unregisterService((*i)->getName());
      MINIROS_DEBUG( "shutting down service %s", (*i)->getName().c_str());
      (*i)->drop();
    }
    service_publications_.clear();
  }

  std::list<ServiceServerLinkPtr> local_service_clients;
  {
    std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
    local_service_clients.swap(service_server_links_);
  }
  for (const auto& link: local_service_clients)
  {
    link->getConnection()->drop(Connection::Destructing);
  }

  local_service_clients.clear();
}